

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3tokBestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  sqlite3_index_constraint_usage *psVar1;
  long lVar2;
  uchar *puVar3;
  
  if (0 < (long)pInfo->nConstraint) {
    puVar3 = &pInfo->aConstraint->usable;
    lVar2 = 0;
    do {
      if (((*puVar3 != '\0') && (((sqlite3_index_constraint *)(puVar3 + -5))->iColumn == 0)) &&
         (puVar3[-1] == '\x02')) {
        pInfo->idxNum = 1;
        psVar1 = pInfo->aConstraintUsage;
        psVar1[lVar2].argvIndex = 1;
        psVar1[lVar2].omit = '\x01';
        pInfo->estimatedCost = 1.0;
        return 0;
      }
      lVar2 = lVar2 + 1;
      puVar3 = puVar3 + 0xc;
    } while (pInfo->nConstraint != lVar2);
  }
  pInfo->idxNum = 0;
  return 0;
}

Assistant:

static int fts3tokBestIndexMethod(
  sqlite3_vtab *pVTab, 
  sqlite3_index_info *pInfo
){
  int i;
  UNUSED_PARAMETER(pVTab);

  for(i=0; i<pInfo->nConstraint; i++){
    if( pInfo->aConstraint[i].usable 
     && pInfo->aConstraint[i].iColumn==0 
     && pInfo->aConstraint[i].op==SQLITE_INDEX_CONSTRAINT_EQ 
    ){
      pInfo->idxNum = 1;
      pInfo->aConstraintUsage[i].argvIndex = 1;
      pInfo->aConstraintUsage[i].omit = 1;
      pInfo->estimatedCost = 1;
      return SQLITE_OK;
    }
  }

  pInfo->idxNum = 0;
  assert( pInfo->estimatedCost>1000000.0 );

  return SQLITE_OK;
}